

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * format_abi_cxx11_(string *__return_storage_ptr__,double value,int width,int precision)

{
  stringstream s;
  long local_1a8;
  long alStack_1a0 [48];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  *(long *)((long)alStack_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)width;
  *(long *)((long)alStack_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
  std::ostream::_M_insert<double>(value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (double value, int width, int precision)
{
  std::stringstream s;
  s.width (width);
  s.precision (precision);
  s << value;
  return s.str ();
}